

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  int iVar3;
  undefined4 uVar4;
  uint uVar5;
  ulong uVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 (*pauVar63) [16];
  uint uVar64;
  undefined1 (*pauVar65) [16];
  long lVar66;
  uint uVar67;
  ulong uVar68;
  long lVar69;
  ulong uVar70;
  ulong uVar71;
  Scene *pSVar72;
  ulong uVar73;
  ulong uVar74;
  float fVar75;
  undefined1 auVar77 [16];
  float fVar82;
  float fVar83;
  undefined1 auVar76 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  float fVar84;
  undefined1 auVar85 [16];
  float fVar90;
  float fVar91;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar92;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  float fVar105;
  float fVar106;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar108;
  float fVar110;
  float fVar112;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar107;
  float fVar109;
  float fVar111;
  float fVar113;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar121;
  float fVar122;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar119 [32];
  float fVar123;
  float fVar127;
  undefined1 auVar120 [32];
  float fVar130;
  float fVar131;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [64];
  undefined1 auVar139 [32];
  undefined1 auVar140 [64];
  float fVar141;
  float fVar142;
  undefined1 auVar143 [32];
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar144 [64];
  float fVar157;
  float fVar158;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar162 [64];
  undefined1 auVar169 [32];
  undefined1 auVar170 [64];
  float fVar171;
  undefined1 auVar172 [32];
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar173 [64];
  float fVar180;
  float fVar181;
  undefined1 auVar182 [32];
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  undefined1 auVar183 [64];
  float fVar197;
  undefined1 auVar198 [32];
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  undefined1 auVar199 [64];
  undefined1 auVar206 [32];
  undefined1 auVar207 [64];
  float fVar208;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar209 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1540 [16];
  undefined1 (*local_1530) [16];
  long local_1528;
  ulong local_1520;
  ulong local_1518;
  RTCFilterFunctionNArguments local_1510;
  undefined1 local_14e0 [32];
  undefined1 local_14b0 [16];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1430 [16];
  undefined1 local_1420 [16];
  undefined1 local_1410 [16];
  undefined1 local_1400 [16];
  undefined1 local_13f0 [16];
  undefined1 local_13e0 [16];
  undefined1 local_13d0 [16];
  undefined1 local_13c0 [16];
  undefined1 local_13b0 [16];
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  RTCHitN local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  undefined4 local_1330;
  undefined4 uStack_132c;
  undefined4 uStack_1328;
  undefined4 uStack_1324;
  undefined1 local_1320 [16];
  undefined1 local_1310 [16];
  uint local_1300;
  uint uStack_12fc;
  uint uStack_12f8;
  uint uStack_12f4;
  uint uStack_12f0;
  uint uStack_12ec;
  uint uStack_12e8;
  uint uStack_12e4;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  float local_11a0 [4];
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  undefined4 uStack_1184;
  float local_1180 [4];
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  undefined4 uStack_1164;
  float local_1160 [4];
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  undefined4 uStack_1144;
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar65 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_13b0._4_4_ = uVar2;
  local_13b0._0_4_ = uVar2;
  local_13b0._8_4_ = uVar2;
  local_13b0._12_4_ = uVar2;
  auVar140 = ZEXT1664(local_13b0);
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_13c0._4_4_ = uVar2;
  local_13c0._0_4_ = uVar2;
  local_13c0._8_4_ = uVar2;
  local_13c0._12_4_ = uVar2;
  auVar144 = ZEXT1664(local_13c0);
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_13d0._4_4_ = uVar2;
  local_13d0._0_4_ = uVar2;
  local_13d0._8_4_ = uVar2;
  local_13d0._12_4_ = uVar2;
  auVar162 = ZEXT1664(local_13d0);
  fVar84 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar90 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar91 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar76 = ZEXT416((uint)(fVar84 * 0.99999964));
  local_13e0 = vshufps_avx(auVar76,auVar76,0);
  auVar170 = ZEXT1664(local_13e0);
  auVar76 = ZEXT416((uint)(fVar90 * 0.99999964));
  local_13f0 = vshufps_avx(auVar76,auVar76,0);
  auVar173 = ZEXT1664(local_13f0);
  auVar76 = ZEXT416((uint)(fVar91 * 0.99999964));
  local_1400 = vshufps_avx(auVar76,auVar76,0);
  auVar183 = ZEXT1664(local_1400);
  auVar76 = ZEXT416((uint)(fVar84 * 1.0000004));
  local_1410 = vshufps_avx(auVar76,auVar76,0);
  auVar199 = ZEXT1664(local_1410);
  auVar76 = ZEXT416((uint)(fVar90 * 1.0000004));
  local_1420 = vshufps_avx(auVar76,auVar76,0);
  auVar207 = ZEXT1664(local_1420);
  auVar76 = ZEXT416((uint)(fVar91 * 1.0000004));
  local_1430 = vshufps_avx(auVar76,auVar76,0);
  auVar209 = ZEXT1664(local_1430);
  uVar70 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1518 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar73 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1520 = uVar70 ^ 0x10;
  uVar74 = local_1518 ^ 0x10;
  iVar3 = (tray->tnear).field_0.i[k];
  local_14b0._4_4_ = iVar3;
  local_14b0._0_4_ = iVar3;
  local_14b0._8_4_ = iVar3;
  local_14b0._12_4_ = iVar3;
  auVar138 = ZEXT1664(local_14b0);
  iVar3 = (tray->tfar).field_0.i[k];
  auVar81 = ZEXT1664(CONCAT412(iVar3,CONCAT48(iVar3,CONCAT44(iVar3,iVar3))));
  local_1100._16_16_ = mm_lookupmask_ps._240_16_;
  local_1100._0_16_ = mm_lookupmask_ps._0_16_;
  local_1530 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar119._8_4_ = 0x3f800000;
  auVar119._0_8_ = 0x3f8000003f800000;
  auVar119._12_4_ = 0x3f800000;
  auVar119._16_4_ = 0x3f800000;
  auVar119._20_4_ = 0x3f800000;
  auVar119._24_4_ = 0x3f800000;
  auVar119._28_4_ = 0x3f800000;
  auVar86._8_4_ = 0xbf800000;
  auVar86._0_8_ = 0xbf800000bf800000;
  auVar86._12_4_ = 0xbf800000;
  auVar86._16_4_ = 0xbf800000;
  auVar86._20_4_ = 0xbf800000;
  auVar86._24_4_ = 0xbf800000;
  auVar86._28_4_ = 0xbf800000;
  local_1120 = vblendvps_avx(auVar119,auVar86,local_1100);
LAB_00333080:
  do {
    pauVar63 = pauVar65 + -1;
    pauVar65 = pauVar65 + -1;
    if (*(float *)(*pauVar63 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
      uVar68 = *(ulong *)*pauVar65;
      while ((uVar68 & 8) == 0) {
        auVar76 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + uVar70),auVar140._0_16_);
        auVar85._0_4_ = auVar170._0_4_ * auVar76._0_4_;
        auVar85._4_4_ = auVar170._4_4_ * auVar76._4_4_;
        auVar85._8_4_ = auVar170._8_4_ * auVar76._8_4_;
        auVar85._12_4_ = auVar170._12_4_ * auVar76._12_4_;
        auVar76 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + local_1518),auVar144._0_16_);
        auVar96._0_4_ = auVar173._0_4_ * auVar76._0_4_;
        auVar96._4_4_ = auVar173._4_4_ * auVar76._4_4_;
        auVar96._8_4_ = auVar173._8_4_ * auVar76._8_4_;
        auVar96._12_4_ = auVar173._12_4_ * auVar76._12_4_;
        auVar76 = vmaxps_avx(auVar85,auVar96);
        auVar85 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + uVar73),auVar162._0_16_);
        auVar97._0_4_ = auVar183._0_4_ * auVar85._0_4_;
        auVar97._4_4_ = auVar183._4_4_ * auVar85._4_4_;
        auVar97._8_4_ = auVar183._8_4_ * auVar85._8_4_;
        auVar97._12_4_ = auVar183._12_4_ * auVar85._12_4_;
        auVar85 = vmaxps_avx(auVar97,auVar138._0_16_);
        auVar85 = vmaxps_avx(auVar76,auVar85);
        auVar76 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + local_1520),auVar140._0_16_);
        auVar98._0_4_ = auVar199._0_4_ * auVar76._0_4_;
        auVar98._4_4_ = auVar199._4_4_ * auVar76._4_4_;
        auVar98._8_4_ = auVar199._8_4_ * auVar76._8_4_;
        auVar98._12_4_ = auVar199._12_4_ * auVar76._12_4_;
        auVar76 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + uVar74),auVar144._0_16_);
        auVar115._0_4_ = auVar207._0_4_ * auVar76._0_4_;
        auVar115._4_4_ = auVar207._4_4_ * auVar76._4_4_;
        auVar115._8_4_ = auVar207._8_4_ * auVar76._8_4_;
        auVar115._12_4_ = auVar207._12_4_ * auVar76._12_4_;
        auVar76 = vminps_avx(auVar98,auVar115);
        auVar96 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + (uVar73 ^ 0x10)),auVar162._0_16_
                            );
        auVar116._0_4_ = auVar209._0_4_ * auVar96._0_4_;
        auVar116._4_4_ = auVar209._4_4_ * auVar96._4_4_;
        auVar116._8_4_ = auVar209._8_4_ * auVar96._8_4_;
        auVar116._12_4_ = auVar209._12_4_ * auVar96._12_4_;
        auVar96 = vminps_avx(auVar116,auVar81._0_16_);
        auVar76 = vminps_avx(auVar76,auVar96);
        auVar76 = vcmpps_avx(auVar85,auVar76,2);
        uVar67 = vmovmskps_avx(auVar76);
        local_12e0._0_16_ = auVar85;
        if (uVar67 == 0) {
          if (pauVar65 == (undefined1 (*) [16])&local_fa0) {
            return;
          }
          goto LAB_00333080;
        }
        uVar67 = uVar67 & 0xff;
        uVar71 = uVar68 & 0xfffffffffffffff0;
        lVar69 = 0;
        if (uVar67 != 0) {
          for (; (uVar67 >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
          }
        }
        uVar68 = *(ulong *)(uVar71 + lVar69 * 8);
        uVar67 = uVar67 - 1 & uVar67;
        if (uVar67 != 0) {
          uVar64 = *(uint *)(local_12e0 + lVar69 * 4);
          lVar69 = 0;
          if (uVar67 != 0) {
            for (; (uVar67 >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
            }
          }
          uVar6 = *(ulong *)(uVar71 + lVar69 * 8);
          uVar5 = *(uint *)(local_12e0 + lVar69 * 4);
          uVar67 = uVar67 - 1 & uVar67;
          if (uVar67 == 0) {
            if (uVar64 < uVar5) {
              *(ulong *)*pauVar65 = uVar6;
              *(uint *)(*pauVar65 + 8) = uVar5;
              pauVar65 = pauVar65 + 1;
            }
            else {
              *(ulong *)*pauVar65 = uVar68;
              *(uint *)(*pauVar65 + 8) = uVar64;
              pauVar65 = pauVar65 + 1;
              uVar68 = uVar6;
            }
          }
          else {
            auVar76._8_8_ = 0;
            auVar76._0_8_ = uVar68;
            auVar76 = vpunpcklqdq_avx(auVar76,ZEXT416(uVar64));
            auVar99._8_8_ = 0;
            auVar99._0_8_ = uVar6;
            auVar85 = vpunpcklqdq_avx(auVar99,ZEXT416(uVar5));
            lVar69 = 0;
            if (uVar67 != 0) {
              for (; (uVar67 >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
              }
            }
            auVar117._8_8_ = 0;
            auVar117._0_8_ = *(ulong *)(uVar71 + lVar69 * 8);
            auVar97 = vpunpcklqdq_avx(auVar117,ZEXT416(*(uint *)(local_12e0 + lVar69 * 4)));
            auVar96 = vpcmpgtd_avx(auVar85,auVar76);
            uVar67 = uVar67 - 1 & uVar67;
            if (uVar67 == 0) {
              auVar98 = vpshufd_avx(auVar96,0xaa);
              auVar96 = vblendvps_avx(auVar85,auVar76,auVar98);
              auVar76 = vblendvps_avx(auVar76,auVar85,auVar98);
              auVar85 = vpcmpgtd_avx(auVar97,auVar96);
              auVar98 = vpshufd_avx(auVar85,0xaa);
              auVar85 = vblendvps_avx(auVar97,auVar96,auVar98);
              auVar96 = vblendvps_avx(auVar96,auVar97,auVar98);
              auVar97 = vpcmpgtd_avx(auVar96,auVar76);
              auVar98 = vpshufd_avx(auVar97,0xaa);
              auVar97 = vblendvps_avx(auVar96,auVar76,auVar98);
              auVar76 = vblendvps_avx(auVar76,auVar96,auVar98);
              *pauVar65 = auVar76;
              pauVar65[1] = auVar97;
              uVar68 = auVar85._0_8_;
              pauVar65 = pauVar65 + 2;
            }
            else {
              lVar69 = 0;
              if (uVar67 != 0) {
                for (; (uVar67 >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
                }
              }
              auVar132._8_8_ = 0;
              auVar132._0_8_ = *(ulong *)(uVar71 + lVar69 * 8);
              auVar115 = vpunpcklqdq_avx(auVar132,ZEXT416(*(uint *)(local_12e0 + lVar69 * 4)));
              auVar98 = vpshufd_avx(auVar96,0xaa);
              auVar96 = vblendvps_avx(auVar85,auVar76,auVar98);
              auVar76 = vblendvps_avx(auVar76,auVar85,auVar98);
              auVar85 = vpcmpgtd_avx(auVar115,auVar97);
              auVar98 = vpshufd_avx(auVar85,0xaa);
              auVar85 = vblendvps_avx(auVar115,auVar97,auVar98);
              auVar97 = vblendvps_avx(auVar97,auVar115,auVar98);
              auVar98 = vpcmpgtd_avx(auVar97,auVar76);
              auVar115 = vpshufd_avx(auVar98,0xaa);
              auVar98 = vblendvps_avx(auVar97,auVar76,auVar115);
              auVar76 = vblendvps_avx(auVar76,auVar97,auVar115);
              auVar97 = vpcmpgtd_avx(auVar85,auVar96);
              auVar115 = vpshufd_avx(auVar97,0xaa);
              auVar97 = vblendvps_avx(auVar85,auVar96,auVar115);
              auVar85 = vblendvps_avx(auVar96,auVar85,auVar115);
              auVar96 = vpcmpgtd_avx(auVar98,auVar85);
              auVar115 = vpshufd_avx(auVar96,0xaa);
              auVar96 = vblendvps_avx(auVar98,auVar85,auVar115);
              auVar85 = vblendvps_avx(auVar85,auVar98,auVar115);
              *pauVar65 = auVar76;
              pauVar65[1] = auVar85;
              pauVar65[2] = auVar96;
              auVar138 = ZEXT1664(local_14b0);
              uVar68 = auVar97._0_8_;
              pauVar65 = pauVar65 + 3;
            }
          }
        }
      }
      local_1528 = (ulong)((uint)uVar68 & 0xf) - 8;
      if (local_1528 != 0) {
        uVar68 = uVar68 & 0xfffffffffffffff0;
        lVar69 = 0;
        do {
          lVar66 = lVar69 * 0xe0;
          lVar1 = uVar68 + 0xd0 + lVar66;
          local_13a0 = *(undefined8 *)(lVar1 + 0x10);
          uStack_1398 = *(undefined8 *)(lVar1 + 0x18);
          lVar1 = uVar68 + 0xc0 + lVar66;
          local_fc0 = *(undefined8 *)(lVar1 + 0x10);
          uStack_fb8 = *(undefined8 *)(lVar1 + 0x18);
          uStack_fb0 = local_fc0;
          uStack_fa8 = uStack_fb8;
          uStack_1390 = local_13a0;
          uStack_1388 = uStack_1398;
          auVar78._16_16_ = *(undefined1 (*) [16])(uVar68 + 0x60 + lVar66);
          auVar78._0_16_ = *(undefined1 (*) [16])(uVar68 + lVar66);
          auVar87._16_16_ = *(undefined1 (*) [16])(uVar68 + 0x70 + lVar66);
          auVar87._0_16_ = *(undefined1 (*) [16])(uVar68 + 0x10 + lVar66);
          auVar100._16_16_ = *(undefined1 (*) [16])(uVar68 + 0x80 + lVar66);
          auVar100._0_16_ = *(undefined1 (*) [16])(uVar68 + 0x20 + lVar66);
          auVar76 = *(undefined1 (*) [16])(uVar68 + 0x30 + lVar66);
          auVar133._16_16_ = auVar76;
          auVar133._0_16_ = auVar76;
          auVar76 = *(undefined1 (*) [16])(uVar68 + 0x40 + lVar66);
          auVar136._16_16_ = auVar76;
          auVar136._0_16_ = auVar76;
          auVar76 = *(undefined1 (*) [16])(uVar68 + 0x50 + lVar66);
          auVar139._16_16_ = auVar76;
          auVar139._0_16_ = auVar76;
          auVar76 = *(undefined1 (*) [16])(uVar68 + 0x90 + lVar66);
          auVar143._16_16_ = auVar76;
          auVar143._0_16_ = auVar76;
          auVar76 = *(undefined1 (*) [16])(uVar68 + 0xa0 + lVar66);
          auVar159._16_16_ = auVar76;
          auVar159._0_16_ = auVar76;
          auVar85 = *(undefined1 (*) [16])(uVar68 + 0xb0 + lVar66);
          auVar169._16_16_ = auVar85;
          auVar169._0_16_ = auVar85;
          uVar2 = *(undefined4 *)(ray + k * 4);
          auVar172._4_4_ = uVar2;
          auVar172._0_4_ = uVar2;
          auVar172._8_4_ = uVar2;
          auVar172._12_4_ = uVar2;
          auVar172._16_4_ = uVar2;
          auVar172._20_4_ = uVar2;
          auVar172._24_4_ = uVar2;
          auVar172._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar182._4_4_ = uVar2;
          auVar182._0_4_ = uVar2;
          auVar182._8_4_ = uVar2;
          auVar182._12_4_ = uVar2;
          auVar182._16_4_ = uVar2;
          auVar182._20_4_ = uVar2;
          auVar182._24_4_ = uVar2;
          auVar182._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar206._4_4_ = uVar2;
          auVar206._0_4_ = uVar2;
          auVar206._8_4_ = uVar2;
          auVar206._12_4_ = uVar2;
          auVar206._16_4_ = uVar2;
          auVar206._20_4_ = uVar2;
          auVar206._24_4_ = uVar2;
          auVar206._28_4_ = uVar2;
          auVar86 = vsubps_avx(auVar78,auVar172);
          local_14a0 = vsubps_avx(auVar87,auVar182);
          local_fe0 = vsubps_avx(auVar100,auVar206);
          auVar119 = vsubps_avx(auVar133,auVar172);
          auVar28 = vsubps_avx(auVar136,auVar182);
          auVar29 = vsubps_avx(auVar139,auVar206);
          auVar30 = vsubps_avx(auVar143,auVar172);
          auVar31 = vsubps_avx(auVar159,auVar182);
          auVar32 = vsubps_avx(auVar169,auVar206);
          local_1000 = vsubps_avx(auVar30,auVar86);
          local_1020 = vsubps_avx(auVar31,local_14a0);
          local_1040 = vsubps_avx(auVar32,local_fe0);
          fVar9 = local_14a0._0_4_;
          fVar84 = auVar31._0_4_ + fVar9;
          fVar12 = local_14a0._4_4_;
          fVar90 = auVar31._4_4_ + fVar12;
          fVar107 = local_14a0._8_4_;
          fVar91 = auVar31._8_4_ + fVar107;
          fVar113 = local_14a0._12_4_;
          fVar92 = auVar31._12_4_ + fVar113;
          fVar15 = local_14a0._16_4_;
          fVar93 = auVar31._16_4_ + fVar15;
          fVar18 = local_14a0._20_4_;
          fVar94 = auVar31._20_4_ + fVar18;
          fVar21 = local_14a0._24_4_;
          fVar95 = auVar31._24_4_ + fVar21;
          fVar10 = local_fe0._0_4_;
          fVar141 = auVar32._0_4_ + fVar10;
          fVar105 = local_fe0._4_4_;
          fVar145 = auVar32._4_4_ + fVar105;
          fVar109 = local_fe0._8_4_;
          fVar147 = auVar32._8_4_ + fVar109;
          fVar13 = local_fe0._12_4_;
          fVar149 = auVar32._12_4_ + fVar13;
          fVar16 = local_fe0._16_4_;
          fVar151 = auVar32._16_4_ + fVar16;
          fVar19 = local_fe0._20_4_;
          fVar153 = auVar32._20_4_ + fVar19;
          fVar22 = local_fe0._24_4_;
          fVar155 = auVar32._24_4_ + fVar22;
          fVar158 = local_fe0._28_4_;
          fVar24 = local_1040._0_4_;
          fVar25 = local_1040._4_4_;
          auVar33._4_4_ = fVar90 * fVar25;
          auVar33._0_4_ = fVar84 * fVar24;
          fVar26 = local_1040._8_4_;
          auVar33._8_4_ = fVar91 * fVar26;
          fVar27 = local_1040._12_4_;
          auVar33._12_4_ = fVar92 * fVar27;
          fVar75 = local_1040._16_4_;
          auVar33._16_4_ = fVar93 * fVar75;
          fVar82 = local_1040._20_4_;
          auVar33._20_4_ = fVar94 * fVar82;
          fVar83 = local_1040._24_4_;
          auVar33._24_4_ = fVar95 * fVar83;
          auVar33._28_4_ = auVar76._12_4_;
          fVar180 = local_1020._0_4_;
          fVar184 = local_1020._4_4_;
          auVar34._4_4_ = fVar184 * fVar145;
          auVar34._0_4_ = fVar180 * fVar141;
          fVar186 = local_1020._8_4_;
          auVar34._8_4_ = fVar186 * fVar147;
          fVar188 = local_1020._12_4_;
          auVar34._12_4_ = fVar188 * fVar149;
          fVar190 = local_1020._16_4_;
          auVar34._16_4_ = fVar190 * fVar151;
          fVar192 = local_1020._20_4_;
          auVar34._20_4_ = fVar192 * fVar153;
          fVar194 = local_1020._24_4_;
          auVar34._24_4_ = fVar194 * fVar155;
          auVar34._28_4_ = auVar85._12_4_;
          auVar33 = vsubps_avx(auVar34,auVar33);
          fVar11 = auVar86._0_4_;
          fVar157 = auVar30._0_4_ + fVar11;
          fVar106 = auVar86._4_4_;
          fVar163 = auVar30._4_4_ + fVar106;
          fVar111 = auVar86._8_4_;
          fVar164 = auVar30._8_4_ + fVar111;
          fVar14 = auVar86._12_4_;
          fVar165 = auVar30._12_4_ + fVar14;
          fVar17 = auVar86._16_4_;
          fVar166 = auVar30._16_4_ + fVar17;
          fVar20 = auVar86._20_4_;
          fVar167 = auVar30._20_4_ + fVar20;
          fVar23 = auVar86._24_4_;
          fVar168 = auVar30._24_4_ + fVar23;
          fVar171 = local_1000._0_4_;
          fVar174 = local_1000._4_4_;
          auVar35._4_4_ = fVar174 * fVar145;
          auVar35._0_4_ = fVar171 * fVar141;
          fVar175 = local_1000._8_4_;
          auVar35._8_4_ = fVar175 * fVar147;
          fVar176 = local_1000._12_4_;
          auVar35._12_4_ = fVar176 * fVar149;
          fVar177 = local_1000._16_4_;
          auVar35._16_4_ = fVar177 * fVar151;
          fVar178 = local_1000._20_4_;
          auVar35._20_4_ = fVar178 * fVar153;
          fVar179 = local_1000._24_4_;
          auVar35._24_4_ = fVar179 * fVar155;
          auVar35._28_4_ = auVar32._28_4_ + fVar158;
          auVar78 = local_1040;
          auVar36._4_4_ = fVar163 * fVar25;
          auVar36._0_4_ = fVar157 * fVar24;
          auVar36._8_4_ = fVar164 * fVar26;
          auVar36._12_4_ = fVar165 * fVar27;
          auVar36._16_4_ = fVar166 * fVar75;
          auVar36._20_4_ = fVar167 * fVar82;
          auVar36._24_4_ = fVar168 * fVar83;
          auVar36._28_4_ = auVar85._12_4_;
          auVar34 = vsubps_avx(auVar36,auVar35);
          auVar36 = local_1020;
          auVar37._4_4_ = fVar163 * fVar184;
          auVar37._0_4_ = fVar157 * fVar180;
          auVar37._8_4_ = fVar164 * fVar186;
          auVar37._12_4_ = fVar165 * fVar188;
          auVar37._16_4_ = fVar166 * fVar190;
          auVar37._20_4_ = fVar167 * fVar192;
          auVar37._24_4_ = fVar168 * fVar194;
          auVar37._28_4_ = auVar30._28_4_ + auVar86._28_4_;
          auVar38._4_4_ = fVar174 * fVar90;
          auVar38._0_4_ = fVar171 * fVar84;
          auVar38._8_4_ = fVar175 * fVar91;
          auVar38._12_4_ = fVar176 * fVar92;
          auVar38._16_4_ = fVar177 * fVar93;
          auVar38._20_4_ = fVar178 * fVar94;
          auVar38._24_4_ = fVar179 * fVar95;
          auVar38._28_4_ = auVar31._28_4_ + local_14a0._28_4_;
          auVar35 = vsubps_avx(auVar38,auVar37);
          fVar84 = *(float *)(ray + k * 4 + 0x50);
          fVar90 = *(float *)(ray + k * 4 + 0x60);
          fVar91 = *(float *)(ray + k * 4 + 0x40);
          local_1080._0_4_ =
               auVar33._0_4_ * fVar91 + fVar84 * auVar34._0_4_ + auVar35._0_4_ * fVar90;
          local_1080._4_4_ =
               auVar33._4_4_ * fVar91 + fVar84 * auVar34._4_4_ + auVar35._4_4_ * fVar90;
          local_1080._8_4_ =
               auVar33._8_4_ * fVar91 + fVar84 * auVar34._8_4_ + auVar35._8_4_ * fVar90;
          local_1080._12_4_ =
               auVar33._12_4_ * fVar91 + fVar84 * auVar34._12_4_ + auVar35._12_4_ * fVar90;
          local_1080._16_4_ =
               auVar33._16_4_ * fVar91 + fVar84 * auVar34._16_4_ + auVar35._16_4_ * fVar90;
          local_1080._20_4_ =
               auVar33._20_4_ * fVar91 + fVar84 * auVar34._20_4_ + auVar35._20_4_ * fVar90;
          local_1080._24_4_ =
               auVar33._24_4_ * fVar91 + fVar84 * auVar34._24_4_ + auVar35._24_4_ * fVar90;
          local_1080._28_4_ = auVar34._28_4_ + auVar34._28_4_ + auVar35._28_4_;
          local_1060 = vsubps_avx(local_14a0,auVar28);
          auVar34 = vsubps_avx(local_fe0,auVar29);
          fVar94 = fVar9 + auVar28._0_4_;
          fVar95 = fVar12 + auVar28._4_4_;
          fVar141 = fVar107 + auVar28._8_4_;
          fVar145 = fVar113 + auVar28._12_4_;
          fVar147 = fVar15 + auVar28._16_4_;
          fVar149 = fVar18 + auVar28._20_4_;
          fVar151 = fVar21 + auVar28._24_4_;
          fVar92 = auVar28._28_4_;
          fVar153 = fVar10 + auVar29._0_4_;
          fVar155 = fVar105 + auVar29._4_4_;
          fVar157 = fVar109 + auVar29._8_4_;
          fVar163 = fVar13 + auVar29._12_4_;
          fVar164 = fVar16 + auVar29._16_4_;
          fVar165 = fVar19 + auVar29._20_4_;
          fVar166 = fVar22 + auVar29._24_4_;
          fVar93 = auVar29._28_4_;
          fVar197 = auVar34._0_4_;
          fVar200 = auVar34._4_4_;
          auVar39._4_4_ = fVar200 * fVar95;
          auVar39._0_4_ = fVar197 * fVar94;
          fVar201 = auVar34._8_4_;
          auVar39._8_4_ = fVar201 * fVar141;
          fVar202 = auVar34._12_4_;
          auVar39._12_4_ = fVar202 * fVar145;
          fVar203 = auVar34._16_4_;
          auVar39._16_4_ = fVar203 * fVar147;
          fVar204 = auVar34._20_4_;
          auVar39._20_4_ = fVar204 * fVar149;
          fVar205 = auVar34._24_4_;
          auVar39._24_4_ = fVar205 * fVar151;
          auVar39._28_4_ = auVar33._28_4_;
          fVar142 = local_1060._0_4_;
          fVar146 = local_1060._4_4_;
          auVar40._4_4_ = fVar146 * fVar155;
          auVar40._0_4_ = fVar142 * fVar153;
          fVar148 = local_1060._8_4_;
          auVar40._8_4_ = fVar148 * fVar157;
          fVar150 = local_1060._12_4_;
          auVar40._12_4_ = fVar150 * fVar163;
          fVar152 = local_1060._16_4_;
          auVar40._16_4_ = fVar152 * fVar164;
          fVar154 = local_1060._20_4_;
          auVar40._20_4_ = fVar154 * fVar165;
          fVar156 = local_1060._24_4_;
          auVar40._24_4_ = fVar156 * fVar166;
          auVar40._28_4_ = fVar158;
          auVar33 = vsubps_avx(auVar40,auVar39);
          auVar34 = vsubps_avx(auVar86,auVar119);
          fVar208 = auVar34._0_4_;
          fVar210 = auVar34._4_4_;
          auVar41._4_4_ = fVar210 * fVar155;
          auVar41._0_4_ = fVar208 * fVar153;
          fVar211 = auVar34._8_4_;
          auVar41._8_4_ = fVar211 * fVar157;
          fVar212 = auVar34._12_4_;
          auVar41._12_4_ = fVar212 * fVar163;
          fVar213 = auVar34._16_4_;
          auVar41._16_4_ = fVar213 * fVar164;
          fVar214 = auVar34._20_4_;
          auVar41._20_4_ = fVar214 * fVar165;
          fVar215 = auVar34._24_4_;
          auVar41._24_4_ = fVar215 * fVar166;
          auVar41._28_4_ = fVar158 + fVar93;
          fVar158 = auVar119._0_4_ + fVar11;
          fVar153 = auVar119._4_4_ + fVar106;
          fVar155 = auVar119._8_4_ + fVar111;
          fVar157 = auVar119._12_4_ + fVar14;
          fVar163 = auVar119._16_4_ + fVar17;
          fVar164 = auVar119._20_4_ + fVar20;
          fVar165 = auVar119._24_4_ + fVar23;
          fVar196 = auVar119._28_4_;
          auVar42._4_4_ = fVar153 * fVar200;
          auVar42._0_4_ = fVar158 * fVar197;
          auVar42._8_4_ = fVar155 * fVar201;
          auVar42._12_4_ = fVar157 * fVar202;
          auVar42._16_4_ = fVar163 * fVar203;
          auVar42._20_4_ = fVar164 * fVar204;
          auVar42._24_4_ = fVar165 * fVar205;
          auVar42._28_4_ = fVar196;
          auVar34 = vsubps_avx(auVar42,auVar41);
          auVar43._4_4_ = fVar153 * fVar146;
          auVar43._0_4_ = fVar158 * fVar142;
          auVar43._8_4_ = fVar155 * fVar148;
          auVar43._12_4_ = fVar157 * fVar150;
          auVar43._16_4_ = fVar163 * fVar152;
          auVar43._20_4_ = fVar164 * fVar154;
          auVar43._24_4_ = fVar165 * fVar156;
          auVar43._28_4_ = fVar196 + auVar86._28_4_;
          auVar44._4_4_ = fVar210 * fVar95;
          auVar44._0_4_ = fVar208 * fVar94;
          auVar44._8_4_ = fVar211 * fVar141;
          auVar44._12_4_ = fVar212 * fVar145;
          auVar44._16_4_ = fVar213 * fVar147;
          auVar44._20_4_ = fVar214 * fVar149;
          auVar44._24_4_ = fVar215 * fVar151;
          auVar44._28_4_ = local_14a0._28_4_ + fVar92;
          auVar86 = vsubps_avx(auVar44,auVar43);
          local_10a0._0_4_ =
               fVar91 * auVar33._0_4_ + auVar86._0_4_ * fVar90 + fVar84 * auVar34._0_4_;
          local_10a0._4_4_ =
               fVar91 * auVar33._4_4_ + auVar86._4_4_ * fVar90 + fVar84 * auVar34._4_4_;
          local_10a0._8_4_ =
               fVar91 * auVar33._8_4_ + auVar86._8_4_ * fVar90 + fVar84 * auVar34._8_4_;
          local_10a0._12_4_ =
               fVar91 * auVar33._12_4_ + auVar86._12_4_ * fVar90 + fVar84 * auVar34._12_4_;
          local_10a0._16_4_ =
               fVar91 * auVar33._16_4_ + auVar86._16_4_ * fVar90 + fVar84 * auVar34._16_4_;
          local_10a0._20_4_ =
               fVar91 * auVar33._20_4_ + auVar86._20_4_ * fVar90 + fVar84 * auVar34._20_4_;
          local_10a0._24_4_ =
               fVar91 * auVar33._24_4_ + auVar86._24_4_ * fVar90 + fVar84 * auVar34._24_4_;
          local_10a0._28_4_ = auVar34._28_4_ + auVar86._28_4_ + auVar34._28_4_;
          auVar33 = vsubps_avx(auVar119,auVar30);
          fVar165 = auVar119._0_4_ + auVar30._0_4_;
          fVar166 = auVar119._4_4_ + auVar30._4_4_;
          fVar167 = auVar119._8_4_ + auVar30._8_4_;
          fVar168 = auVar119._12_4_ + auVar30._12_4_;
          fVar108 = auVar119._16_4_ + auVar30._16_4_;
          fVar110 = auVar119._20_4_ + auVar30._20_4_;
          fVar112 = auVar119._24_4_ + auVar30._24_4_;
          auVar34 = vsubps_avx(auVar28,auVar31);
          fVar114 = auVar28._0_4_ + auVar31._0_4_;
          fVar121 = auVar28._4_4_ + auVar31._4_4_;
          fVar122 = auVar28._8_4_ + auVar31._8_4_;
          fVar123 = auVar28._12_4_ + auVar31._12_4_;
          fVar124 = auVar28._16_4_ + auVar31._16_4_;
          fVar125 = auVar28._20_4_ + auVar31._20_4_;
          fVar126 = auVar28._24_4_ + auVar31._24_4_;
          fVar127 = fVar92 + auVar31._28_4_;
          auVar86 = vsubps_avx(auVar29,auVar32);
          fVar153 = auVar32._0_4_ + auVar29._0_4_;
          fVar155 = auVar32._4_4_ + auVar29._4_4_;
          fVar157 = auVar32._8_4_ + auVar29._8_4_;
          fVar163 = auVar32._12_4_ + auVar29._12_4_;
          fVar164 = auVar32._16_4_ + auVar29._16_4_;
          fVar130 = auVar32._20_4_ + auVar29._20_4_;
          fVar131 = auVar32._24_4_ + auVar29._24_4_;
          fVar181 = auVar86._0_4_;
          fVar185 = auVar86._4_4_;
          auVar28._4_4_ = fVar185 * fVar121;
          auVar28._0_4_ = fVar181 * fVar114;
          fVar187 = auVar86._8_4_;
          auVar28._8_4_ = fVar187 * fVar122;
          fVar189 = auVar86._12_4_;
          auVar28._12_4_ = fVar189 * fVar123;
          fVar191 = auVar86._16_4_;
          auVar28._16_4_ = fVar191 * fVar124;
          fVar193 = auVar86._20_4_;
          auVar28._20_4_ = fVar193 * fVar125;
          fVar195 = auVar86._24_4_;
          auVar28._24_4_ = fVar195 * fVar126;
          auVar28._28_4_ = fVar92;
          fVar158 = auVar34._0_4_;
          fVar92 = auVar34._4_4_;
          auVar29._4_4_ = fVar92 * fVar155;
          auVar29._0_4_ = fVar158 * fVar153;
          fVar94 = auVar34._8_4_;
          auVar29._8_4_ = fVar94 * fVar157;
          fVar95 = auVar34._12_4_;
          auVar29._12_4_ = fVar95 * fVar163;
          fVar141 = auVar34._16_4_;
          auVar29._16_4_ = fVar141 * fVar164;
          fVar145 = auVar34._20_4_;
          auVar29._20_4_ = fVar145 * fVar130;
          fVar147 = auVar34._24_4_;
          auVar29._24_4_ = fVar147 * fVar131;
          auVar29._28_4_ = fVar93;
          auVar86 = vsubps_avx(auVar29,auVar28);
          fVar149 = auVar33._0_4_;
          fVar151 = auVar33._4_4_;
          auVar31._4_4_ = fVar151 * fVar155;
          auVar31._0_4_ = fVar149 * fVar153;
          fVar153 = auVar33._8_4_;
          auVar31._8_4_ = fVar153 * fVar157;
          fVar155 = auVar33._12_4_;
          auVar31._12_4_ = fVar155 * fVar163;
          fVar157 = auVar33._16_4_;
          auVar31._16_4_ = fVar157 * fVar164;
          fVar163 = auVar33._20_4_;
          auVar31._20_4_ = fVar163 * fVar130;
          fVar164 = auVar33._24_4_;
          auVar31._24_4_ = fVar164 * fVar131;
          auVar31._28_4_ = auVar32._28_4_ + fVar93;
          auVar32._4_4_ = fVar185 * fVar166;
          auVar32._0_4_ = fVar181 * fVar165;
          auVar32._8_4_ = fVar187 * fVar167;
          auVar32._12_4_ = fVar189 * fVar168;
          auVar32._16_4_ = fVar191 * fVar108;
          auVar32._20_4_ = fVar193 * fVar110;
          auVar32._24_4_ = fVar195 * fVar112;
          auVar32._28_4_ = fVar93;
          auVar119 = vsubps_avx(auVar32,auVar31);
          auVar45._4_4_ = fVar166 * fVar92;
          auVar45._0_4_ = fVar165 * fVar158;
          auVar45._8_4_ = fVar167 * fVar94;
          auVar45._12_4_ = fVar168 * fVar95;
          auVar45._16_4_ = fVar108 * fVar141;
          auVar45._20_4_ = fVar110 * fVar145;
          auVar45._24_4_ = fVar112 * fVar147;
          auVar45._28_4_ = fVar196 + auVar30._28_4_;
          auVar30._4_4_ = fVar151 * fVar121;
          auVar30._0_4_ = fVar149 * fVar114;
          auVar30._8_4_ = fVar153 * fVar122;
          auVar30._12_4_ = fVar155 * fVar123;
          auVar30._16_4_ = fVar157 * fVar124;
          auVar30._20_4_ = fVar163 * fVar125;
          auVar30._24_4_ = fVar164 * fVar126;
          auVar30._28_4_ = fVar127;
          auVar28 = vsubps_avx(auVar30,auVar45);
          auVar101._0_4_ = fVar91 * auVar86._0_4_ + auVar28._0_4_ * fVar90 + fVar84 * auVar119._0_4_
          ;
          auVar101._4_4_ = fVar91 * auVar86._4_4_ + auVar28._4_4_ * fVar90 + fVar84 * auVar119._4_4_
          ;
          auVar101._8_4_ = fVar91 * auVar86._8_4_ + auVar28._8_4_ * fVar90 + fVar84 * auVar119._8_4_
          ;
          auVar101._12_4_ =
               fVar91 * auVar86._12_4_ + auVar28._12_4_ * fVar90 + fVar84 * auVar119._12_4_;
          auVar101._16_4_ =
               fVar91 * auVar86._16_4_ + auVar28._16_4_ * fVar90 + fVar84 * auVar119._16_4_;
          auVar101._20_4_ =
               fVar91 * auVar86._20_4_ + auVar28._20_4_ * fVar90 + fVar84 * auVar119._20_4_;
          auVar101._24_4_ =
               fVar91 * auVar86._24_4_ + auVar28._24_4_ * fVar90 + fVar84 * auVar119._24_4_;
          auVar101._28_4_ = fVar127 + auVar28._28_4_ + fVar127;
          local_10c0._0_4_ = auVar101._0_4_ + local_1080._0_4_ + local_10a0._0_4_;
          local_10c0._4_4_ = auVar101._4_4_ + local_1080._4_4_ + local_10a0._4_4_;
          local_10c0._8_4_ = auVar101._8_4_ + local_1080._8_4_ + local_10a0._8_4_;
          local_10c0._12_4_ = auVar101._12_4_ + local_1080._12_4_ + local_10a0._12_4_;
          local_10c0._16_4_ = auVar101._16_4_ + local_1080._16_4_ + local_10a0._16_4_;
          local_10c0._20_4_ = auVar101._20_4_ + local_1080._20_4_ + local_10a0._20_4_;
          local_10c0._24_4_ = auVar101._24_4_ + local_1080._24_4_ + local_10a0._24_4_;
          local_10c0._28_4_ = auVar101._28_4_ + local_1080._28_4_ + local_10a0._28_4_;
          auVar86 = vminps_avx(local_1080,local_10a0);
          auVar86 = vminps_avx(auVar86,auVar101);
          auVar128._8_4_ = 0x7fffffff;
          auVar128._0_8_ = 0x7fffffff7fffffff;
          auVar128._12_4_ = 0x7fffffff;
          auVar128._16_4_ = 0x7fffffff;
          auVar128._20_4_ = 0x7fffffff;
          auVar128._24_4_ = 0x7fffffff;
          auVar128._28_4_ = 0x7fffffff;
          local_10e0 = vandps_avx(local_10c0,auVar128);
          fVar165 = local_10e0._0_4_ * 1.1920929e-07;
          fVar166 = local_10e0._4_4_ * 1.1920929e-07;
          auVar46._4_4_ = fVar166;
          auVar46._0_4_ = fVar165;
          fVar167 = local_10e0._8_4_ * 1.1920929e-07;
          auVar46._8_4_ = fVar167;
          fVar168 = local_10e0._12_4_ * 1.1920929e-07;
          auVar46._12_4_ = fVar168;
          fVar108 = local_10e0._16_4_ * 1.1920929e-07;
          auVar46._16_4_ = fVar108;
          fVar110 = local_10e0._20_4_ * 1.1920929e-07;
          auVar46._20_4_ = fVar110;
          fVar112 = local_10e0._24_4_ * 1.1920929e-07;
          auVar46._24_4_ = fVar112;
          auVar46._28_4_ = 0x34000000;
          auVar137._0_8_ = CONCAT44(fVar166,fVar165) ^ 0x8000000080000000;
          auVar137._8_4_ = -fVar167;
          auVar137._12_4_ = -fVar168;
          auVar137._16_4_ = -fVar108;
          auVar137._20_4_ = -fVar110;
          auVar137._24_4_ = -fVar112;
          auVar137._28_4_ = 0xb4000000;
          auVar86 = vcmpps_avx(auVar86,auVar137,5);
          auVar28 = vmaxps_avx(local_1080,local_10a0);
          auVar119 = vmaxps_avx(auVar28,auVar101);
          auVar119 = vcmpps_avx(auVar119,auVar46,2);
          auVar119 = vorps_avx(auVar86,auVar119);
          if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar119 >> 0x7f,0) != '\0') ||
                (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar119 >> 0xbf,0) != '\0') ||
              (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar119[0x1f] < '\0') {
            auVar47._4_4_ = fVar146 * fVar25;
            auVar47._0_4_ = fVar142 * fVar24;
            auVar47._8_4_ = fVar148 * fVar26;
            auVar47._12_4_ = fVar150 * fVar27;
            auVar47._16_4_ = fVar152 * fVar75;
            auVar47._20_4_ = fVar154 * fVar82;
            auVar47._24_4_ = fVar156 * fVar83;
            auVar47._28_4_ = auVar86._28_4_;
            auVar48._4_4_ = fVar184 * fVar200;
            auVar48._0_4_ = fVar180 * fVar197;
            auVar48._8_4_ = fVar186 * fVar201;
            auVar48._12_4_ = fVar188 * fVar202;
            auVar48._16_4_ = fVar190 * fVar203;
            auVar48._20_4_ = fVar192 * fVar204;
            auVar48._24_4_ = fVar194 * fVar205;
            auVar48._28_4_ = 0x34000000;
            auVar29 = vsubps_avx(auVar48,auVar47);
            auVar49._4_4_ = fVar200 * fVar92;
            auVar49._0_4_ = fVar197 * fVar158;
            auVar49._8_4_ = fVar201 * fVar94;
            auVar49._12_4_ = fVar202 * fVar95;
            auVar49._16_4_ = fVar203 * fVar141;
            auVar49._20_4_ = fVar204 * fVar145;
            auVar49._24_4_ = fVar205 * fVar147;
            auVar49._28_4_ = auVar28._28_4_;
            auVar50._4_4_ = fVar146 * fVar185;
            auVar50._0_4_ = fVar142 * fVar181;
            auVar50._8_4_ = fVar148 * fVar187;
            auVar50._12_4_ = fVar150 * fVar189;
            auVar50._16_4_ = fVar152 * fVar191;
            auVar50._20_4_ = fVar154 * fVar193;
            auVar50._24_4_ = fVar156 * fVar195;
            auVar50._28_4_ = fVar93;
            auVar30 = vsubps_avx(auVar50,auVar49);
            auVar160._8_4_ = 0x7fffffff;
            auVar160._0_8_ = 0x7fffffff7fffffff;
            auVar160._12_4_ = 0x7fffffff;
            auVar160._16_4_ = 0x7fffffff;
            auVar160._20_4_ = 0x7fffffff;
            auVar160._24_4_ = 0x7fffffff;
            auVar160._28_4_ = 0x7fffffff;
            auVar86 = vandps_avx(auVar160,auVar47);
            auVar28 = vandps_avx(auVar160,auVar49);
            auVar86 = vcmpps_avx(auVar86,auVar28,1);
            local_1280 = vblendvps_avx(auVar30,auVar29,auVar86);
            auVar51._4_4_ = fVar210 * fVar185;
            auVar51._0_4_ = fVar208 * fVar181;
            auVar51._8_4_ = fVar211 * fVar187;
            auVar51._12_4_ = fVar212 * fVar189;
            auVar51._16_4_ = fVar213 * fVar191;
            auVar51._20_4_ = fVar214 * fVar193;
            auVar51._24_4_ = fVar215 * fVar195;
            auVar51._28_4_ = auVar86._28_4_;
            auVar52._4_4_ = fVar210 * fVar25;
            auVar52._0_4_ = fVar208 * fVar24;
            auVar52._8_4_ = fVar211 * fVar26;
            auVar52._12_4_ = fVar212 * fVar27;
            auVar52._16_4_ = fVar213 * fVar75;
            auVar52._20_4_ = fVar214 * fVar82;
            auVar52._24_4_ = fVar215 * fVar83;
            auVar52._28_4_ = auVar29._28_4_;
            auVar53._4_4_ = fVar200 * fVar174;
            auVar53._0_4_ = fVar197 * fVar171;
            auVar53._8_4_ = fVar201 * fVar175;
            auVar53._12_4_ = fVar202 * fVar176;
            auVar53._16_4_ = fVar203 * fVar177;
            auVar53._20_4_ = fVar204 * fVar178;
            auVar53._24_4_ = fVar205 * fVar179;
            auVar53._28_4_ = local_1040._28_4_;
            auVar29 = vsubps_avx(auVar52,auVar53);
            auVar54._4_4_ = fVar200 * fVar151;
            auVar54._0_4_ = fVar197 * fVar149;
            auVar54._8_4_ = fVar201 * fVar153;
            auVar54._12_4_ = fVar202 * fVar155;
            auVar54._16_4_ = fVar203 * fVar157;
            auVar54._20_4_ = fVar204 * fVar163;
            auVar54._24_4_ = fVar205 * fVar164;
            auVar54._28_4_ = auVar28._28_4_;
            auVar30 = vsubps_avx(auVar54,auVar51);
            auVar86 = vandps_avx(auVar160,auVar53);
            auVar28 = vandps_avx(auVar160,auVar51);
            auVar86 = vcmpps_avx(auVar86,auVar28,1);
            local_1260 = vblendvps_avx(auVar30,auVar29,auVar86);
            auVar55._4_4_ = fVar146 * fVar151;
            auVar55._0_4_ = fVar142 * fVar149;
            auVar55._8_4_ = fVar148 * fVar153;
            auVar55._12_4_ = fVar150 * fVar155;
            auVar55._16_4_ = fVar152 * fVar157;
            auVar55._20_4_ = fVar154 * fVar163;
            auVar55._24_4_ = fVar156 * fVar164;
            auVar55._28_4_ = auVar33._28_4_;
            auVar56._4_4_ = fVar146 * fVar174;
            auVar56._0_4_ = fVar142 * fVar171;
            auVar56._8_4_ = fVar148 * fVar175;
            auVar56._12_4_ = fVar150 * fVar176;
            auVar56._16_4_ = fVar152 * fVar177;
            auVar56._20_4_ = fVar154 * fVar178;
            auVar56._24_4_ = fVar156 * fVar179;
            auVar56._28_4_ = auVar86._28_4_;
            auVar57._4_4_ = fVar210 * fVar184;
            auVar57._0_4_ = fVar208 * fVar180;
            auVar57._8_4_ = fVar211 * fVar186;
            auVar57._12_4_ = fVar212 * fVar188;
            auVar57._16_4_ = fVar213 * fVar190;
            auVar57._20_4_ = fVar214 * fVar192;
            auVar57._24_4_ = fVar215 * fVar194;
            auVar57._28_4_ = auVar29._28_4_;
            auVar58._4_4_ = fVar210 * fVar92;
            auVar58._0_4_ = fVar208 * fVar158;
            auVar58._8_4_ = fVar211 * fVar94;
            auVar58._12_4_ = fVar212 * fVar95;
            auVar58._16_4_ = fVar213 * fVar141;
            auVar58._20_4_ = fVar214 * fVar145;
            auVar58._24_4_ = fVar215 * fVar147;
            auVar58._28_4_ = auVar34._28_4_;
            auVar29 = vsubps_avx(auVar56,auVar57);
            auVar30 = vsubps_avx(auVar58,auVar55);
            auVar86 = vandps_avx(auVar160,auVar57);
            auVar28 = vandps_avx(auVar160,auVar55);
            auVar28 = vcmpps_avx(auVar86,auVar28,1);
            local_1240 = vblendvps_avx(auVar30,auVar29,auVar28);
            auVar76 = vpackssdw_avx(auVar119._0_16_,auVar119._16_16_);
            fVar145 = local_1240._0_4_;
            fVar147 = local_1240._4_4_;
            fVar149 = local_1240._8_4_;
            fVar151 = local_1240._12_4_;
            fVar153 = local_1240._16_4_;
            fVar155 = local_1240._20_4_;
            fVar157 = local_1240._24_4_;
            fVar163 = local_1260._0_4_;
            fVar164 = local_1260._4_4_;
            fVar165 = local_1260._8_4_;
            fVar166 = local_1260._12_4_;
            fVar167 = local_1260._16_4_;
            fVar168 = local_1260._20_4_;
            fVar108 = local_1260._24_4_;
            fVar158 = local_1280._0_4_;
            fVar92 = local_1280._4_4_;
            fVar93 = local_1280._8_4_;
            fVar24 = local_1280._12_4_;
            fVar25 = local_1280._16_4_;
            fVar26 = local_1280._20_4_;
            fVar27 = local_1280._24_4_;
            fVar75 = fVar91 * fVar158 + fVar145 * fVar90 + fVar163 * fVar84;
            fVar82 = fVar91 * fVar92 + fVar147 * fVar90 + fVar164 * fVar84;
            fVar83 = fVar91 * fVar93 + fVar149 * fVar90 + fVar165 * fVar84;
            fVar94 = fVar91 * fVar24 + fVar151 * fVar90 + fVar166 * fVar84;
            fVar95 = fVar91 * fVar25 + fVar153 * fVar90 + fVar167 * fVar84;
            fVar141 = fVar91 * fVar26 + fVar155 * fVar90 + fVar168 * fVar84;
            fVar84 = fVar91 * fVar27 + fVar157 * fVar90 + fVar108 * fVar84;
            fVar90 = auVar119._28_4_ + auVar119._28_4_ + 0.0;
            auVar79._0_4_ = fVar75 + fVar75;
            auVar79._4_4_ = fVar82 + fVar82;
            auVar79._8_4_ = fVar83 + fVar83;
            auVar79._12_4_ = fVar94 + fVar94;
            auVar79._16_4_ = fVar95 + fVar95;
            auVar79._20_4_ = fVar141 + fVar141;
            auVar79._24_4_ = fVar84 + fVar84;
            auVar79._28_4_ = fVar90 + fVar90;
            fVar75 = fVar158 * fVar11 + fVar145 * fVar10 + fVar163 * fVar9;
            fVar105 = fVar92 * fVar106 + fVar147 * fVar105 + fVar164 * fVar12;
            fVar106 = fVar93 * fVar111 + fVar149 * fVar109 + fVar165 * fVar107;
            fVar107 = fVar24 * fVar14 + fVar151 * fVar13 + fVar166 * fVar113;
            fVar109 = fVar25 * fVar17 + fVar153 * fVar16 + fVar167 * fVar15;
            fVar111 = fVar26 * fVar20 + fVar155 * fVar19 + fVar168 * fVar18;
            fVar113 = fVar27 * fVar23 + fVar157 * fVar22 + fVar108 * fVar21;
            auVar119 = vrcpps_avx(auVar79);
            fVar84 = auVar119._0_4_;
            fVar90 = auVar119._4_4_;
            auVar59._4_4_ = auVar79._4_4_ * fVar90;
            auVar59._0_4_ = auVar79._0_4_ * fVar84;
            fVar91 = auVar119._8_4_;
            auVar59._8_4_ = auVar79._8_4_ * fVar91;
            fVar9 = auVar119._12_4_;
            auVar59._12_4_ = auVar79._12_4_ * fVar9;
            fVar10 = auVar119._16_4_;
            auVar59._16_4_ = auVar79._16_4_ * fVar10;
            fVar11 = auVar119._20_4_;
            auVar59._20_4_ = auVar79._20_4_ * fVar11;
            fVar12 = auVar119._24_4_;
            auVar59._24_4_ = auVar79._24_4_ * fVar12;
            auVar59._28_4_ = auVar86._28_4_;
            auVar134._8_4_ = 0x3f800000;
            auVar134._0_8_ = 0x3f8000003f800000;
            auVar134._12_4_ = 0x3f800000;
            auVar134._16_4_ = 0x3f800000;
            auVar134._20_4_ = 0x3f800000;
            auVar134._24_4_ = 0x3f800000;
            auVar134._28_4_ = 0x3f800000;
            auVar86 = vsubps_avx(auVar134,auVar59);
            local_11c0._4_4_ = (fVar105 + fVar105) * (fVar90 + fVar90 * auVar86._4_4_);
            local_11c0._0_4_ = (fVar75 + fVar75) * (fVar84 + fVar84 * auVar86._0_4_);
            local_11c0._8_4_ = (fVar106 + fVar106) * (fVar91 + fVar91 * auVar86._8_4_);
            local_11c0._12_4_ = (fVar107 + fVar107) * (fVar9 + fVar9 * auVar86._12_4_);
            local_11c0._16_4_ = (fVar109 + fVar109) * (fVar10 + fVar10 * auVar86._16_4_);
            local_11c0._20_4_ = (fVar111 + fVar111) * (fVar11 + fVar11 * auVar86._20_4_);
            local_11c0._24_4_ = (fVar113 + fVar113) * (fVar12 + fVar12 * auVar86._24_4_);
            local_11c0._28_4_ = local_1020._28_4_;
            auVar138 = ZEXT3264(local_11c0);
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar102._4_4_ = uVar2;
            auVar102._0_4_ = uVar2;
            auVar102._8_4_ = uVar2;
            auVar102._12_4_ = uVar2;
            auVar102._16_4_ = uVar2;
            auVar102._20_4_ = uVar2;
            auVar102._24_4_ = uVar2;
            auVar102._28_4_ = uVar2;
            auVar86 = vcmpps_avx(auVar102,local_11c0,2);
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar198._4_4_ = uVar2;
            auVar198._0_4_ = uVar2;
            auVar198._8_4_ = uVar2;
            auVar198._12_4_ = uVar2;
            auVar198._16_4_ = uVar2;
            auVar198._20_4_ = uVar2;
            auVar198._24_4_ = uVar2;
            auVar198._28_4_ = uVar2;
            auVar81 = ZEXT3264(auVar198);
            auVar119 = vcmpps_avx(local_11c0,auVar198,2);
            auVar86 = vandps_avx(auVar119,auVar86);
            auVar85 = vpackssdw_avx(auVar86._0_16_,auVar86._16_16_);
            auVar76 = vpand_avx(auVar85,auVar76);
            auVar85 = vpmovsxwd_avx(auVar76);
            auVar96 = vpshufd_avx(auVar76,0xee);
            auVar96 = vpmovsxwd_avx(auVar96);
            auVar103._16_16_ = auVar96;
            auVar103._0_16_ = auVar85;
            if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar103 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar103 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar103 >> 0x7f,0) != '\0') ||
                  (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB161(auVar96 >> 0x3f,0) != '\0') ||
                (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar96[0xf] < '\0') {
              auVar86 = vcmpps_avx(auVar79,_DAT_01faff00,4);
              auVar85 = vpackssdw_avx(auVar86._0_16_,auVar86._16_16_);
              auVar76 = vpand_avx(auVar76,auVar85);
              auVar85 = vpmovsxwd_avx(auVar76);
              auVar96 = vpunpckhwd_avx(auVar76,auVar76);
              local_14e0._16_16_ = auVar96;
              local_14e0._0_16_ = auVar85;
              if ((((((((local_14e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_14e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_14e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_14e0 >> 0x7f,0) != '\0') ||
                    (local_14e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB161(auVar96 >> 0x3f,0) != '\0') ||
                  (local_14e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar96[0xf] < '\0') {
                local_12e0 = local_1080;
                local_12c0 = local_10a0;
                local_12a0 = local_10c0;
                auVar86 = vrcpps_avx(local_10c0);
                fVar84 = auVar86._0_4_;
                fVar90 = auVar86._4_4_;
                auVar60._4_4_ = local_10c0._4_4_ * fVar90;
                auVar60._0_4_ = local_10c0._0_4_ * fVar84;
                fVar91 = auVar86._8_4_;
                auVar60._8_4_ = local_10c0._8_4_ * fVar91;
                fVar9 = auVar86._12_4_;
                auVar60._12_4_ = local_10c0._12_4_ * fVar9;
                fVar10 = auVar86._16_4_;
                auVar60._16_4_ = local_10c0._16_4_ * fVar10;
                fVar11 = auVar86._20_4_;
                auVar60._20_4_ = local_10c0._20_4_ * fVar11;
                fVar12 = auVar86._24_4_;
                auVar60._24_4_ = local_10c0._24_4_ * fVar12;
                auVar60._28_4_ = local_10c0._28_4_;
                auVar161._8_4_ = 0x3f800000;
                auVar161._0_8_ = 0x3f8000003f800000;
                auVar161._12_4_ = 0x3f800000;
                auVar161._16_4_ = 0x3f800000;
                auVar161._20_4_ = 0x3f800000;
                auVar161._24_4_ = 0x3f800000;
                auVar161._28_4_ = 0x3f800000;
                auVar119 = vsubps_avx(auVar161,auVar60);
                auVar129._0_4_ = fVar84 + fVar84 * auVar119._0_4_;
                auVar129._4_4_ = fVar90 + fVar90 * auVar119._4_4_;
                auVar129._8_4_ = fVar91 + fVar91 * auVar119._8_4_;
                auVar129._12_4_ = fVar9 + fVar9 * auVar119._12_4_;
                auVar129._16_4_ = fVar10 + fVar10 * auVar119._16_4_;
                auVar129._20_4_ = fVar11 + fVar11 * auVar119._20_4_;
                auVar129._24_4_ = fVar12 + fVar12 * auVar119._24_4_;
                auVar129._28_4_ = auVar86._28_4_ + auVar119._28_4_;
                auVar135._8_4_ = 0x219392ef;
                auVar135._0_8_ = 0x219392ef219392ef;
                auVar135._12_4_ = 0x219392ef;
                auVar135._16_4_ = 0x219392ef;
                auVar135._20_4_ = 0x219392ef;
                auVar135._24_4_ = 0x219392ef;
                auVar135._28_4_ = 0x219392ef;
                auVar119 = vcmpps_avx(local_10e0,auVar135,5);
                auVar86 = vandps_avx(auVar119,auVar129);
                local_1220 = local_14e0;
                local_1140 = local_1100;
                pSVar72 = context->scene;
                auVar61._4_4_ = local_1080._4_4_ * auVar86._4_4_;
                auVar61._0_4_ = local_1080._0_4_ * auVar86._0_4_;
                auVar61._8_4_ = local_1080._8_4_ * auVar86._8_4_;
                auVar61._12_4_ = local_1080._12_4_ * auVar86._12_4_;
                auVar61._16_4_ = local_1080._16_4_ * auVar86._16_4_;
                auVar61._20_4_ = local_1080._20_4_ * auVar86._20_4_;
                auVar61._24_4_ = local_1080._24_4_ * auVar86._24_4_;
                auVar61._28_4_ = auVar119._28_4_;
                auVar119 = vminps_avx(auVar61,auVar161);
                auVar62._4_4_ = local_10a0._4_4_ * auVar86._4_4_;
                auVar62._0_4_ = local_10a0._0_4_ * auVar86._0_4_;
                auVar62._8_4_ = local_10a0._8_4_ * auVar86._8_4_;
                auVar62._12_4_ = local_10a0._12_4_ * auVar86._12_4_;
                auVar62._16_4_ = local_10a0._16_4_ * auVar86._16_4_;
                auVar62._20_4_ = local_10a0._20_4_ * auVar86._20_4_;
                auVar62._24_4_ = local_10a0._24_4_ * auVar86._24_4_;
                auVar62._28_4_ = auVar86._28_4_;
                auVar86 = vminps_avx(auVar62,auVar161);
                auVar28 = vsubps_avx(auVar161,auVar119);
                local_11e0 = vblendvps_avx(auVar86,auVar28,local_1100);
                auVar86 = vsubps_avx(auVar161,auVar86);
                local_1200 = vblendvps_avx(auVar119,auVar86,local_1100);
                fVar84 = local_1120._0_4_;
                fVar90 = local_1120._4_4_;
                fVar91 = local_1120._8_4_;
                fVar9 = local_1120._12_4_;
                fVar10 = local_1120._16_4_;
                fVar11 = local_1120._20_4_;
                fVar12 = local_1120._24_4_;
                uStack_1184 = local_1200._28_4_;
                local_11a0[0] = fVar158 * fVar84;
                local_11a0[1] = fVar92 * fVar90;
                local_11a0[2] = fVar93 * fVar91;
                local_11a0[3] = fVar24 * fVar9;
                fStack_1190 = fVar25 * fVar10;
                fStack_118c = fVar26 * fVar11;
                fStack_1188 = fVar27 * fVar12;
                local_1180[0] = fVar163 * fVar84;
                local_1180[1] = fVar164 * fVar90;
                local_1180[2] = fVar165 * fVar91;
                local_1180[3] = fVar166 * fVar9;
                fStack_1170 = fVar167 * fVar10;
                fStack_116c = fVar168 * fVar11;
                fStack_1168 = fVar108 * fVar12;
                uStack_1164 = uStack_1184;
                auVar104._16_16_ = auVar96;
                auVar104._0_16_ = auVar85;
                auVar120._8_4_ = 0x7f800000;
                auVar120._0_8_ = 0x7f8000007f800000;
                auVar120._12_4_ = 0x7f800000;
                auVar120._16_4_ = 0x7f800000;
                auVar120._20_4_ = 0x7f800000;
                auVar120._24_4_ = 0x7f800000;
                auVar120._28_4_ = 0x7f800000;
                auVar86 = vblendvps_avx(auVar120,local_11c0,auVar104);
                local_1160[0] = fVar84 * fVar145;
                local_1160[1] = fVar90 * fVar147;
                local_1160[2] = fVar91 * fVar149;
                local_1160[3] = fVar9 * fVar151;
                fStack_1150 = fVar10 * fVar153;
                fStack_114c = fVar11 * fVar155;
                fStack_1148 = fVar12 * fVar157;
                uStack_1144 = uStack_1184;
                auVar119 = vshufps_avx(auVar86,auVar86,0xb1);
                auVar119 = vminps_avx(auVar86,auVar119);
                auVar28 = vshufpd_avx(auVar119,auVar119,5);
                auVar119 = vminps_avx(auVar119,auVar28);
                auVar28 = vperm2f128_avx(auVar119,auVar119,1);
                auVar119 = vminps_avx(auVar119,auVar28);
                auVar86 = vcmpps_avx(auVar86,auVar119,0);
                auVar85 = vpackssdw_avx(auVar86._0_16_,auVar86._16_16_);
                auVar76 = vpand_avx(auVar85,auVar76);
                auVar85 = vpmovsxwd_avx(auVar76);
                auVar76 = vpunpckhwd_avx(auVar76,auVar76);
                auVar88._16_16_ = auVar76;
                auVar88._0_16_ = auVar85;
                if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar88 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar88 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar88 >> 0x7f,0) == '\0') &&
                      (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB161(auVar76 >> 0x3f,0) == '\0') &&
                    (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar76[0xf]) {
                  auVar88 = local_14e0;
                }
                uVar64 = vmovmskps_avx(auVar88);
                uVar67 = 0;
                local_1040 = auVar78;
                local_1020 = auVar36;
                if (uVar64 != 0) {
                  for (; (uVar64 >> uVar67 & 1) == 0; uVar67 = uVar67 + 1) {
                  }
                }
LAB_0033394b:
                uVar71 = (ulong)uVar67;
                uVar67 = *(uint *)((long)&local_fc0 + uVar71 * 4);
                pGVar7 = (pSVar72->geometries).items[uVar67].ptr;
                if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  *(undefined4 *)(local_14e0 + uVar71 * 4) = 0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar2 = *(undefined4 *)(local_1200 + uVar71 * 4);
                    uVar4 = *(undefined4 *)(local_11e0 + uVar71 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11c0 + uVar71 * 4);
                    *(float *)(ray + k * 4 + 0xc0) = local_11a0[uVar71];
                    *(float *)(ray + k * 4 + 0xd0) = local_1180[uVar71];
                    *(float *)(ray + k * 4 + 0xe0) = local_1160[uVar71];
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar2;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
                    *(undefined4 *)(ray + k * 4 + 0x110) =
                         *(undefined4 *)((long)&local_13a0 + uVar71 * 4);
                    *(uint *)(ray + k * 4 + 0x120) = uVar67;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    goto LAB_00333dc8;
                  }
                  uVar2 = *(undefined4 *)(local_1200 + uVar71 * 4);
                  local_1340._4_4_ = uVar2;
                  local_1340._0_4_ = uVar2;
                  local_1340._8_4_ = uVar2;
                  local_1340._12_4_ = uVar2;
                  local_1330 = *(undefined4 *)(local_11e0 + uVar71 * 4);
                  local_1310 = vpshufd_avx(ZEXT416(uVar67),0);
                  uVar2 = *(undefined4 *)((long)&local_13a0 + uVar71 * 4);
                  auVar118._4_4_ = uVar2;
                  auVar118._0_4_ = uVar2;
                  auVar118._8_4_ = uVar2;
                  auVar118._12_4_ = uVar2;
                  fVar84 = local_11a0[uVar71];
                  fVar90 = local_1180[uVar71];
                  local_1360._4_4_ = fVar90;
                  local_1360._0_4_ = fVar90;
                  local_1360._8_4_ = fVar90;
                  local_1360._12_4_ = fVar90;
                  fVar90 = local_1160[uVar71];
                  local_1350._4_4_ = fVar90;
                  local_1350._0_4_ = fVar90;
                  local_1350._8_4_ = fVar90;
                  local_1350._12_4_ = fVar90;
                  local_1370[0] = (RTCHitN)SUB41(fVar84,0);
                  local_1370[1] = (RTCHitN)(char)((uint)fVar84 >> 8);
                  local_1370[2] = (RTCHitN)(char)((uint)fVar84 >> 0x10);
                  local_1370[3] = (RTCHitN)(char)((uint)fVar84 >> 0x18);
                  local_1370[4] = (RTCHitN)SUB41(fVar84,0);
                  local_1370[5] = (RTCHitN)(char)((uint)fVar84 >> 8);
                  local_1370[6] = (RTCHitN)(char)((uint)fVar84 >> 0x10);
                  local_1370[7] = (RTCHitN)(char)((uint)fVar84 >> 0x18);
                  local_1370[8] = (RTCHitN)SUB41(fVar84,0);
                  local_1370[9] = (RTCHitN)(char)((uint)fVar84 >> 8);
                  local_1370[10] = (RTCHitN)(char)((uint)fVar84 >> 0x10);
                  local_1370[0xb] = (RTCHitN)(char)((uint)fVar84 >> 0x18);
                  local_1370[0xc] = (RTCHitN)SUB41(fVar84,0);
                  local_1370[0xd] = (RTCHitN)(char)((uint)fVar84 >> 8);
                  local_1370[0xe] = (RTCHitN)(char)((uint)fVar84 >> 0x10);
                  local_1370[0xf] = (RTCHitN)(char)((uint)fVar84 >> 0x18);
                  uStack_132c = local_1330;
                  uStack_1328 = local_1330;
                  uStack_1324 = local_1330;
                  local_1320 = auVar118;
                  vcmpps_avx(ZEXT1632(local_1340),ZEXT1632(local_1340),0xf);
                  uStack_12fc = context->user->instID[0];
                  local_1300 = uStack_12fc;
                  uStack_12f8 = uStack_12fc;
                  uStack_12f4 = uStack_12fc;
                  uStack_12f0 = context->user->instPrimID[0];
                  uStack_12ec = uStack_12f0;
                  uStack_12e8 = uStack_12f0;
                  uStack_12e4 = uStack_12f0;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11c0 + uVar71 * 4);
                  local_1540 = *local_1530;
                  local_1510.valid = (int *)local_1540;
                  local_1510.geometryUserPtr = pGVar7->userPtr;
                  local_1510.context = context->user;
                  local_1510.hit = local_1370;
                  local_1510.N = 4;
                  local_1460 = auVar138._0_32_;
                  local_1480 = auVar81._0_32_;
                  local_14a0._0_8_ = pSVar72;
                  local_1510.ray = (RTCRayN *)ray;
                  if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar7->intersectionFilterN)(&local_1510);
                    auVar81 = ZEXT3264(local_1480);
                    auVar138 = ZEXT3264(local_1460);
                    pSVar72 = (Scene *)local_14a0._0_8_;
                  }
                  if (local_1540 == (undefined1  [16])0x0) {
                    auVar76 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar76 = auVar76 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var8 = context->args->filter;
                    if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var8)(&local_1510);
                      auVar81 = ZEXT3264(local_1480);
                      auVar138 = ZEXT3264(local_1460);
                      pSVar72 = (Scene *)local_14a0._0_8_;
                    }
                    auVar85 = vpcmpeqd_avx(local_1540,_DAT_01f7aa10);
                    auVar96 = vpcmpeqd_avx(auVar118,auVar118);
                    auVar76 = auVar85 ^ auVar96;
                    if (local_1540 != (undefined1  [16])0x0) {
                      auVar85 = auVar85 ^ auVar96;
                      auVar96 = vmaskmovps_avx(auVar85,*(undefined1 (*) [16])local_1510.hit);
                      *(undefined1 (*) [16])(local_1510.ray + 0xc0) = auVar96;
                      auVar96 = vmaskmovps_avx(auVar85,*(undefined1 (*) [16])(local_1510.hit + 0x10)
                                              );
                      *(undefined1 (*) [16])(local_1510.ray + 0xd0) = auVar96;
                      auVar96 = vmaskmovps_avx(auVar85,*(undefined1 (*) [16])(local_1510.hit + 0x20)
                                              );
                      *(undefined1 (*) [16])(local_1510.ray + 0xe0) = auVar96;
                      auVar96 = vmaskmovps_avx(auVar85,*(undefined1 (*) [16])(local_1510.hit + 0x30)
                                              );
                      *(undefined1 (*) [16])(local_1510.ray + 0xf0) = auVar96;
                      auVar96 = vmaskmovps_avx(auVar85,*(undefined1 (*) [16])(local_1510.hit + 0x40)
                                              );
                      *(undefined1 (*) [16])(local_1510.ray + 0x100) = auVar96;
                      auVar96 = vmaskmovps_avx(auVar85,*(undefined1 (*) [16])(local_1510.hit + 0x50)
                                              );
                      *(undefined1 (*) [16])(local_1510.ray + 0x110) = auVar96;
                      auVar96 = vmaskmovps_avx(auVar85,*(undefined1 (*) [16])(local_1510.hit + 0x60)
                                              );
                      *(undefined1 (*) [16])(local_1510.ray + 0x120) = auVar96;
                      auVar96 = vmaskmovps_avx(auVar85,*(undefined1 (*) [16])(local_1510.hit + 0x70)
                                              );
                      *(undefined1 (*) [16])(local_1510.ray + 0x130) = auVar96;
                      auVar85 = vmaskmovps_avx(auVar85,*(undefined1 (*) [16])(local_1510.hit + 0x80)
                                              );
                      *(undefined1 (*) [16])(local_1510.ray + 0x140) = auVar85;
                    }
                  }
                  auVar77._8_8_ = 0x100000001;
                  auVar77._0_8_ = 0x100000001;
                  if ((auVar77 & auVar76) == (undefined1  [16])0x0) {
                    *(int *)(ray + k * 4 + 0x80) = auVar81._0_4_;
                  }
                  else {
                    auVar81 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                  }
                  *(undefined4 *)(local_14e0 + uVar71 * 4) = 0;
                  auVar76 = vshufps_avx(auVar81._0_16_,auVar81._0_16_,0);
                  auVar80._16_16_ = auVar76;
                  auVar80._0_16_ = auVar76;
                  auVar86 = vcmpps_avx(auVar138._0_32_,auVar80,2);
                  local_14e0 = vandps_avx(auVar86,local_14e0);
                }
                if ((((((((local_14e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_14e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_14e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_14e0 >> 0x7f,0) == '\0') &&
                      (local_14e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_14e0 >> 0xbf,0) == '\0') &&
                    (local_14e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_14e0[0x1f]) goto LAB_00333dc8;
                auVar89._8_4_ = 0x7f800000;
                auVar89._0_8_ = 0x7f8000007f800000;
                auVar89._12_4_ = 0x7f800000;
                auVar89._16_4_ = 0x7f800000;
                auVar89._20_4_ = 0x7f800000;
                auVar89._24_4_ = 0x7f800000;
                auVar89._28_4_ = 0x7f800000;
                auVar86 = vblendvps_avx(auVar89,auVar138._0_32_,local_14e0);
                auVar119 = vshufps_avx(auVar86,auVar86,0xb1);
                auVar119 = vminps_avx(auVar86,auVar119);
                auVar28 = vshufpd_avx(auVar119,auVar119,5);
                auVar119 = vminps_avx(auVar119,auVar28);
                auVar28 = vperm2f128_avx(auVar119,auVar119,1);
                auVar119 = vminps_avx(auVar119,auVar28);
                auVar119 = vcmpps_avx(auVar86,auVar119,0);
                auVar28 = local_14e0 & auVar119;
                auVar86 = local_14e0;
                if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar28 >> 0x7f,0) != '\0') ||
                      (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar28 >> 0xbf,0) != '\0') ||
                    (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar28[0x1f] < '\0') {
                  auVar86 = vandps_avx(auVar119,local_14e0);
                }
                uVar64 = vmovmskps_avx(auVar86);
                uVar67 = 0;
                if (uVar64 != 0) {
                  for (; (uVar64 >> uVar67 & 1) == 0; uVar67 = uVar67 + 1) {
                  }
                }
                goto LAB_0033394b;
              }
            }
          }
LAB_00333dc8:
          lVar69 = lVar69 + 1;
        } while (lVar69 != local_1528);
      }
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar81 = ZEXT1664(CONCAT412(uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))));
      auVar140 = ZEXT1664(local_13b0);
      auVar144 = ZEXT1664(local_13c0);
      auVar162 = ZEXT1664(local_13d0);
      auVar170 = ZEXT1664(local_13e0);
      auVar173 = ZEXT1664(local_13f0);
      auVar183 = ZEXT1664(local_1400);
      auVar199 = ZEXT1664(local_1410);
      auVar207 = ZEXT1664(local_1420);
      auVar209 = ZEXT1664(local_1430);
      auVar138 = ZEXT1664(local_14b0);
    }
    if (pauVar65 == (undefined1 (*) [16])&local_fa0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }